

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_test.cpp
# Opt level: O3

void evaluations_test<viennamath::ct_binary_expr<viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>
               (ct_binary_expr<viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
                *e,double ref_solution)

{
  long lVar1;
  return_type rVar2;
  double dVar3;
  ostream *poVar4;
  vector<double,_std::allocator<double>_> local_a8;
  undefined **local_90;
  long local_88;
  ct_variable<1ul> local_80 [8];
  undefined **local_78;
  long local_70;
  ct_variable<1ul> local_68 [8];
  undefined **local_60;
  long local_58;
  ct_variable<1ul> local_50 [8];
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_48;
  
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x18);
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 3;
  *local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 4.0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 6.0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 8.0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  poVar4 = viennamath::operator<<((ostream *)&std::cout,e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," at STL (",9);
  poVar4 = std::ostream::_M_insert<double>
                     (*local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<double>
                     (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<double>
                     (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  lVar1 = (e->lhs_).s;
  rVar2 = viennamath::ct_variable<1ul>::operator()((ct_variable<1ul> *)&e->field_0x10,&local_a8);
  poVar4 = std::ostream::_M_insert<double>(rVar2 + (double)lVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  local_60 = &PTR__rt_expression_interface_0013f8b0;
  lVar1 = (e->lhs_).s;
  local_58 = lVar1;
  rVar2 = viennamath::ct_variable<1ul>::operator()(local_50,&local_a8);
  poVar4 = std::ostream::_M_insert<double>(rVar2 + (double)lVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (reference solution: ",0x16);
  poVar4 = std::ostream::_M_insert<double>(ref_solution);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_78 = &PTR__rt_expression_interface_0013f8b0;
  lVar1 = (e->lhs_).s;
  local_70 = lVar1;
  rVar2 = viennamath::ct_variable<1ul>::operator()(local_68,&local_a8);
  if (rVar2 + (double)lVar1 <= ref_solution) {
    local_90 = &PTR__rt_expression_interface_0013f8b0;
    lVar1 = (e->lhs_).s;
    local_88 = lVar1;
    rVar2 = viennamath::ct_variable<1ul>::operator()(local_80,&local_a8);
    if (ref_solution <= rVar2 + (double)lVar1) {
      poVar4 = viennamath::operator<<((ostream *)&std::cout,e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," at vector_3 (",0xe);
      local_48.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_0013f7f0;
      local_48.t0_.s = 4.0;
      local_48.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_0013f8b0;
      local_48.t1_.s = 6;
      poVar4 = viennamath::operator<<(poVar4,&local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      poVar4 = std::ostream::_M_insert<double>((double)(e->lhs_).s + 6.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      poVar4 = std::ostream::_M_insert<double>((double)(e->lhs_).s + 6.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," (reference solution: ",0x16);
      poVar4 = std::ostream::_M_insert<double>(ref_solution);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      dVar3 = (double)(e->lhs_).s + 6.0;
      if ((dVar3 == ref_solution) && (!NAN(dVar3) && !NAN(ref_solution))) {
        if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        return;
      }
      __assert_fail("viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_test.cpp"
                    ,0x4b,
                    "void evaluations_test(const E &, double) [E = viennamath::ct_binary_expr<viennamath::rt_constant<long>, viennamath::op_plus<double>, viennamath::ct_variable<1>>]"
                   );
    }
  }
  __assert_fail("viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution",
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_test.cpp"
                ,0x45,
                "void evaluations_test(const E &, double) [E = viennamath::ct_binary_expr<viennamath::rt_constant<long>, viennamath::op_plus<double>, viennamath::ct_variable<1>>]"
               );
}

Assistant:

void evaluations_test(E const & e, double ref_solution)
{
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;

  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;

  std::cout << e << " at STL (" << p[0] << ", " << p[1] << ", " << p[2] << ")"
            << " = " << e(p)
            << " = " << viennamath::eval(e,p)
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution);

  std::cout << e << " at vector_3 (" << viennamath::make_vector(c4, c6, c8) << ")"
            << " = " << e(viennamath::make_vector(c4, c6, c8))
            << " = " << viennamath::eval(e, viennamath::make_vector(c4, c6, c8))
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution);
}